

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O0

string * __thiscall phosg::MD5::bin_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  string *__str;
  undefined1 local_38 [8];
  StringWriter w;
  MD5 *this_local;
  
  w.data.field_2._8_8_ = this;
  StringWriter::StringWriter((StringWriter *)local_38);
  StringWriter::put_u32l((StringWriter *)local_38,this->a0);
  StringWriter::put_u32l((StringWriter *)local_38,this->b0);
  StringWriter::put_u32l((StringWriter *)local_38,this->c0);
  StringWriter::put_u32l((StringWriter *)local_38,this->d0);
  __str = StringWriter::str_abi_cxx11_((StringWriter *)local_38);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  StringWriter::~StringWriter((StringWriter *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string MD5::bin() const {
  StringWriter w;
  w.put_u32l(a0);
  w.put_u32l(b0);
  w.put_u32l(c0);
  w.put_u32l(d0);
  return std::move(w.str());
}